

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_pool.hpp
# Opt level: O2

void __thiscall
coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>::client_pool
          (client_pool<cinatra::coro_http_client,_coro_io::io_context_pool> *this,
          client_pools_t *param_2,size_t param_3,char *param_4,pool_config *param_5,
          io_context_pool *param_6)

{
  allocator<char> local_49;
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  (this->
  super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  )._M_weak_this.
  super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->
  super_enable_shared_from_this<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>_>
  )._M_weak_this.
  super___weak_ptr<coro_io::client_pool<cinatra::coro_http_client,_coro_io::io_context_pool>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40._M_len = param_3;
  local_40._M_str = param_4;
  coro_io::detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(&this->free_clients_,(ulong)param_5->max_connection);
  local_48 = &this->free_clients_;
  coro_io::detail::
  client_queue<std::unique_ptr<cinatra::coro_http_client,_std::default_delete<cinatra::coro_http_client>_>_>
  ::client_queue(&this->short_connect_clients_,0);
  this->pools_manager_ = param_2;
  async_simple::Promise<async_simple::Unit>::Promise(&this->idle_timeout_waiter);
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->host_name_,&local_40,&local_49);
  pool_config::pool_config(&this->pool_config_,param_5);
  this->io_context_pool_ = param_6;
  (this->is_alive_)._M_base._M_i = true;
  return;
}

Assistant:

client_pool(private_construct_token t, client_pools_t* pools_manager_,
              std::string_view host_name, const pool_config& pool_config,
              io_context_pool_t& io_context_pool)
      : pools_manager_(pools_manager_),
        host_name_(host_name),
        pool_config_(pool_config),
        io_context_pool_(io_context_pool),
        free_clients_(pool_config.max_connection){}